

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall
QGraphicsItem::setTransformations(QGraphicsItem *this,QList<QGraphicsTransform_*> *transformations)

{
  undefined1 *puVar1;
  QGraphicsItemPrivate *pQVar2;
  TransformData *pTVar3;
  long lVar4;
  qreal *pqVar5;
  TransformData *pTVar6;
  int i;
  ulong uVar7;
  byte bVar8;
  
  bVar8 = 0;
  prepareGeometryChange(this);
  pQVar2 = (this->d_ptr).d;
  pTVar3 = pQVar2->transformData;
  if (pTVar3 == (TransformData *)0x0) {
    pTVar3 = (TransformData *)operator_new(0x90);
    pqVar5 = (qreal *)&DAT_006777b8;
    pTVar6 = pTVar3;
    for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
      (pTVar6->transform).m_matrix[0][0] = *pqVar5;
      pqVar5 = pqVar5 + (ulong)bVar8 * -2 + 1;
      pTVar6 = (TransformData *)((long)pTVar6 + (ulong)bVar8 * -0x10 + 8);
    }
    *(undefined2 *)&(pTVar3->transform).field_0x48 = 0;
    pTVar3->scale = 1.0;
    pTVar3->rotation = 0.0;
    pTVar3->xOrigin = 0.0;
    pTVar3->yOrigin = 0.0;
    (pTVar3->graphicsTransforms).d.d = (Data *)0x0;
    (pTVar3->graphicsTransforms).d.ptr = (QGraphicsTransform **)0x0;
    (pTVar3->graphicsTransforms).d.size = 0;
    pTVar3->onlyTransform = true;
    pQVar2->transformData = pTVar3;
  }
  QArrayDataPointer<QGraphicsTransform_*>::operator=
            (&(pTVar3->graphicsTransforms).d,&transformations->d);
  for (uVar7 = 0; uVar7 < (ulong)(transformations->d).size; uVar7 = uVar7 + 1) {
    QGraphicsTransformPrivate::setItem
              (*(QGraphicsTransformPrivate **)&(transformations->d).ptr[uVar7]->field_0x8,this);
  }
  pQVar2 = (this->d_ptr).d;
  pQVar2->transformData->onlyTransform = false;
  puVar1 = &pQVar2->field_0x166;
  *puVar1 = *puVar1 | 0x20;
  (*((this->d_ptr).d)->_vptr_QGraphicsItemPrivate[4])();
  return;
}

Assistant:

void QGraphicsItem::setTransformations(const QList<QGraphicsTransform *> &transformations)
{
    prepareGeometryChange();
    if (!d_ptr->transformData)
        d_ptr->transformData = new QGraphicsItemPrivate::TransformData;
    d_ptr->transformData->graphicsTransforms = transformations;
    for (int i = 0; i < transformations.size(); ++i)
        transformations.at(i)->d_func()->setItem(this);
    d_ptr->transformData->onlyTransform = false;
    d_ptr->dirtySceneTransform = 1;
    d_ptr->transformChanged();
}